

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::tuple::tuple(tuple *this,object *o)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  
  pPVar1 = (PyObject *)PySequence_Tuple((o->super_handle).m_ptr);
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

explicit tuple(size_t size = 0) : object(PyTuple_New((ssize_t) size), stolen) {
        if (!m_ptr) pybind11_fail("Could not allocate tuple object!");
    }